

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLint GVar5;
  undefined8 uVar6;
  SDL_GLContext pvVar7;
  GLubyte *pGVar8;
  GLenum glError_13;
  GLenum glError_12;
  GLenum glError_11;
  GLenum glError_10;
  GLenum glError_9;
  GLenum glError_8;
  GLenum glError_7;
  GLenum glError_6;
  GLenum glError_5;
  GLenum glError_4;
  GLenum glError_3;
  GLenum glError_2;
  GLenum glError_1;
  GLenum glError;
  int h;
  int w;
  int consumed;
  shader_data *data;
  uint local_48;
  int status;
  Uint32 now;
  Uint32 then;
  SDL_DisplayMode mode;
  int i;
  int value;
  int accel;
  int fsaa;
  char **argv_local;
  int argc_local;
  
  value = 0;
  i = 0;
  state = (SDLTest_CommonState *)SDLTest_CommonCreateState(argv,0x20);
  if (state == (SDLTest_CommonState *)0x0) {
    argv_local._4_4_ = 1;
  }
  else {
    for (mode.driverdata._0_4_ = 1; (int)mode.driverdata < argc;
        mode.driverdata._0_4_ = h + (int)mode.driverdata) {
      h = SDLTest_CommonArg(state,(int)mode.driverdata);
      if (h == 0) {
        iVar2 = SDL_strcasecmp(argv[(int)mode.driverdata],"--fsaa");
        if (iVar2 == 0) {
          value = value + 1;
          h = 1;
        }
        else {
          iVar2 = SDL_strcasecmp(argv[(int)mode.driverdata],"--accel");
          if (iVar2 == 0) {
            i = i + 1;
            h = 1;
          }
          else {
            iVar2 = SDL_strcasecmp(argv[(int)mode.driverdata],"--zdepth");
            if (iVar2 == 0) {
              mode.driverdata._0_4_ = (int)mode.driverdata + 1;
              if (argv[(int)mode.driverdata] == (char *)0x0) {
                h = -1;
              }
              else {
                depth = SDL_atoi(argv[(int)mode.driverdata]);
                h = 1;
              }
            }
            else {
              h = -1;
            }
          }
        }
      }
      if (h < 0) {
        pcVar1 = *argv;
        uVar6 = SDLTest_CommonUsage(state);
        SDL_Log("Usage: %s %s [--fsaa] [--accel] [--zdepth %%d]\n",pcVar1,uVar6);
        quit(1);
      }
    }
    state->window_flags = state->window_flags | 0x33;
    state->gl_red_size = 5;
    state->gl_green_size = 5;
    state->gl_blue_size = 5;
    state->gl_depth_size = depth;
    state->gl_major_version = 2;
    state->gl_minor_version = 0;
    state->gl_profile_mask = 4;
    if (value != 0) {
      state->gl_multisamplebuffers = 1;
      state->gl_multisamplesamples = value;
    }
    if (i != 0) {
      state->gl_accelerated = 1;
    }
    iVar2 = SDLTest_CommonInit(state);
    if (iVar2 == 0) {
      quit(2);
      argv_local._4_4_ = 0;
    }
    else {
      context = (SDL_GLContext *)SDL_calloc((long)state->num_windows,8);
      if (context == (SDL_GLContext *)0x0) {
        SDL_Log("Out of memory!\n");
        quit(2);
      }
      for (mode.driverdata._0_4_ = 0; (int)mode.driverdata < state->num_windows;
          mode.driverdata._0_4_ = (int)mode.driverdata + 1) {
        pvVar7 = (SDL_GLContext)SDL_GL_CreateContext(state->windows[(int)mode.driverdata]);
        context[(int)mode.driverdata] = pvVar7;
        if (context[(int)mode.driverdata] == (SDL_GLContext)0x0) {
          uVar6 = SDL_GetError();
          SDL_Log("SDL_GL_CreateContext(): %s\n",uVar6);
          quit(2);
        }
      }
      iVar2 = LoadContext(&ctx);
      if (iVar2 < 0) {
        SDL_Log("Could not load GLES2 functions\n");
        quit(2);
        argv_local._4_4_ = 0;
      }
      else {
        if ((state->render_flags & 4) == 0) {
          SDL_GL_SetSwapInterval(0);
        }
        else {
          SDL_GL_SetSwapInterval(1);
        }
        SDL_GetCurrentDisplayMode(0,&now);
        SDL_Log("Screen bpp: %d\n",now >> 8 & 0xff);
        SDL_Log("\n");
        pGVar8 = (*ctx.glGetString)(0x1f00);
        SDL_Log("Vendor     : %s\n",pGVar8);
        pGVar8 = (*ctx.glGetString)(0x1f01);
        SDL_Log("Renderer   : %s\n",pGVar8);
        pGVar8 = (*ctx.glGetString)(0x1f02);
        SDL_Log("Version    : %s\n",pGVar8);
        pGVar8 = (*ctx.glGetString)(0x1f03);
        SDL_Log("Extensions : %s\n",pGVar8);
        SDL_Log("\n");
        data._4_4_ = SDL_GL_GetAttribute(0,(undefined1 *)((long)&mode.driverdata + 4));
        if (data._4_4_ == 0) {
          SDL_Log("SDL_GL_RED_SIZE: requested %d, got %d\n",5,mode.driverdata._4_4_);
        }
        else {
          uVar6 = SDL_GetError();
          SDL_Log("Failed to get SDL_GL_RED_SIZE: %s\n",uVar6);
        }
        data._4_4_ = SDL_GL_GetAttribute(1,(undefined1 *)((long)&mode.driverdata + 4));
        if (data._4_4_ == 0) {
          SDL_Log("SDL_GL_GREEN_SIZE: requested %d, got %d\n",5,mode.driverdata._4_4_);
        }
        else {
          uVar6 = SDL_GetError();
          SDL_Log("Failed to get SDL_GL_GREEN_SIZE: %s\n",uVar6);
        }
        data._4_4_ = SDL_GL_GetAttribute(2,(undefined1 *)((long)&mode.driverdata + 4));
        if (data._4_4_ == 0) {
          SDL_Log("SDL_GL_BLUE_SIZE: requested %d, got %d\n",5,mode.driverdata._4_4_);
        }
        else {
          uVar6 = SDL_GetError();
          SDL_Log("Failed to get SDL_GL_BLUE_SIZE: %s\n",uVar6);
        }
        data._4_4_ = SDL_GL_GetAttribute(6,(undefined1 *)((long)&mode.driverdata + 4));
        if (data._4_4_ == 0) {
          SDL_Log("SDL_GL_DEPTH_SIZE: requested %d, got %d\n",depth,mode.driverdata._4_4_);
        }
        else {
          uVar6 = SDL_GetError();
          SDL_Log("Failed to get SDL_GL_DEPTH_SIZE: %s\n",uVar6);
        }
        if (value != 0) {
          data._4_4_ = SDL_GL_GetAttribute(0xd,(undefined1 *)((long)&mode.driverdata + 4));
          if (data._4_4_ == 0) {
            SDL_Log("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n",mode.driverdata._4_4_);
          }
          else {
            uVar6 = SDL_GetError();
            SDL_Log("Failed to get SDL_GL_MULTISAMPLEBUFFERS: %s\n",uVar6);
          }
          data._4_4_ = SDL_GL_GetAttribute(0xe,(undefined1 *)((long)&mode.driverdata + 4));
          if (data._4_4_ == 0) {
            SDL_Log("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n",value,mode.driverdata._4_4_)
            ;
          }
          else {
            uVar6 = SDL_GetError();
            SDL_Log("Failed to get SDL_GL_MULTISAMPLESAMPLES: %s\n",uVar6);
          }
        }
        if (i != 0) {
          data._4_4_ = SDL_GL_GetAttribute(0xf,(undefined1 *)((long)&mode.driverdata + 4));
          if (data._4_4_ == 0) {
            SDL_Log("SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n",mode.driverdata._4_4_);
          }
          else {
            uVar6 = SDL_GetError();
            SDL_Log("Failed to get SDL_GL_ACCELERATED_VISUAL: %s\n",uVar6);
          }
        }
        datas = (shader_data *)SDL_calloc((long)state->num_windows,0x24);
        for (mode.driverdata._0_4_ = 0; (int)mode.driverdata < state->num_windows;
            mode.driverdata._0_4_ = (int)mode.driverdata + 1) {
          data._4_4_ = SDL_GL_MakeCurrent(state->windows[(int)mode.driverdata],
                                          context[(int)mode.driverdata]);
          if (data._4_4_ == 0) {
            SDL_GL_GetDrawableSize(state->windows[(int)mode.driverdata],&glError,&glError_1);
            (*ctx.glViewport)(0,0,glError,glError_1);
            _w = datas + (int)mode.driverdata;
            _w->angle_x = 0;
            _w->angle_y = 0;
            _w->angle_z = 0;
            process_shader(&_w->shader_vert,_shader_vert_src,0x8b31);
            process_shader(&_w->shader_frag,_shader_frag_src,0x8b30);
            GVar3 = (*ctx.glCreateProgram)();
            _w->shader_program = GVar3;
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x292);
              quit(1);
            }
            (*ctx.glAttachShader)(_w->shader_program,_w->shader_vert);
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x295);
              quit(1);
            }
            (*ctx.glAttachShader)(_w->shader_program,_w->shader_frag);
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x296);
              quit(1);
            }
            (*ctx.glLinkProgram)(_w->shader_program);
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x297);
              quit(1);
            }
            GVar5 = (*ctx.glGetAttribLocation)(_w->shader_program,"av4position");
            _w->attr_position = GVar5;
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x29a);
              quit(1);
            }
            GVar5 = (*ctx.glGetAttribLocation)(_w->shader_program,"av3color");
            _w->attr_color = GVar5;
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x29b);
              quit(1);
            }
            GVar5 = (*ctx.glGetUniformLocation)(_w->shader_program,"mvp");
            _w->attr_mvp = GVar5;
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x29e);
              quit(1);
            }
            (*ctx.glUseProgram)(_w->shader_program);
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x2a0);
              quit(1);
            }
            (*ctx.glEnableVertexAttribArray)(_w->attr_position);
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x2a3);
              quit(1);
            }
            (*ctx.glEnableVertexAttribArray)(_w->attr_color);
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x2a4);
              quit(1);
            }
            (*ctx.glVertexAttribPointer)(_w->attr_position,3,0x1406,'\0',0,_vertices);
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x2a7);
              quit(1);
            }
            (*ctx.glVertexAttribPointer)(_w->attr_color,3,0x1406,'\0',0,_colors);
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x2a8);
              quit(1);
            }
            (*ctx.glEnable)(0xb44);
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x2aa);
              quit(1);
            }
            (*ctx.glEnable)(0xb71);
            GVar4 = (*ctx.glGetError)();
            if (GVar4 != 0) {
              SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar4,GVar4,0x2ab);
              quit(1);
            }
          }
          else {
            uVar6 = SDL_GetError();
            SDL_Log("SDL_GL_MakeCurrent(): %s\n",uVar6);
          }
        }
        frames = 0;
        status = SDL_GetTicks();
        done = 0;
        while (done == 0) {
          loop();
        }
        local_48 = SDL_GetTicks();
        if ((uint)status < local_48) {
          SDL_Log(((double)frames * 1000.0) / (double)(local_48 - status));
        }
        quit(0);
        argv_local._4_4_ = 0;
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
    int fsaa, accel;
    int value;
    int i;
    SDL_DisplayMode mode;
    Uint32 then, now;
    int status;
    shader_data *data;

    /* Initialize parameters */
    fsaa = 0;
    accel = 0;

    /* Initialize test framework */
    state = SDLTest_CommonCreateState(argv, SDL_INIT_VIDEO);
    if (!state) {
        return 1;
    }
    for (i = 1; i < argc;) {
        int consumed;

        consumed = SDLTest_CommonArg(state, i);
        if (consumed == 0) {
            if (SDL_strcasecmp(argv[i], "--fsaa") == 0) {
                ++fsaa;
                consumed = 1;
            } else if (SDL_strcasecmp(argv[i], "--accel") == 0) {
                ++accel;
                consumed = 1;
            } else if (SDL_strcasecmp(argv[i], "--zdepth") == 0) {
                i++;
                if (!argv[i]) {
                    consumed = -1;
                } else {
                    depth = SDL_atoi(argv[i]);
                    consumed = 1;
                }
            } else {
                consumed = -1;
            }
        }
        if (consumed < 0) {
            SDL_Log ("Usage: %s %s [--fsaa] [--accel] [--zdepth %%d]\n", argv[0],
                    SDLTest_CommonUsage(state));
            quit(1);
        }
        i += consumed;
    }

    /* Set OpenGL parameters */
    state->window_flags |= SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE | SDL_WINDOW_BORDERLESS | SDL_WINDOW_FULLSCREEN;
    state->gl_red_size = 5;
    state->gl_green_size = 5;
    state->gl_blue_size = 5;
    state->gl_depth_size = depth;
    state->gl_major_version = 2;
    state->gl_minor_version = 0;
    state->gl_profile_mask = SDL_GL_CONTEXT_PROFILE_ES;

    if (fsaa) {
        state->gl_multisamplebuffers=1;
        state->gl_multisamplesamples=fsaa;
    }
    if (accel) {
        state->gl_accelerated=1;
    }
    if (!SDLTest_CommonInit(state)) {
        quit(2);
        return 0;
    }

    context = SDL_calloc(state->num_windows, sizeof(context));
    if (context == NULL) {
        SDL_Log("Out of memory!\n");
        quit(2);
    }
    
    /* Create OpenGL ES contexts */
    for (i = 0; i < state->num_windows; i++) {
        context[i] = SDL_GL_CreateContext(state->windows[i]);
        if (!context[i]) {
            SDL_Log("SDL_GL_CreateContext(): %s\n", SDL_GetError());
            quit(2);
        }
    }

    /* Important: call this *after* creating the context */
    if (LoadContext(&ctx) < 0) {
        SDL_Log("Could not load GLES2 functions\n");
        quit(2);
        return 0;
    }


    if (state->render_flags & SDL_RENDERER_PRESENTVSYNC) {
        SDL_GL_SetSwapInterval(1);
    } else {
        SDL_GL_SetSwapInterval(0);
    }

    SDL_GetCurrentDisplayMode(0, &mode);
    SDL_Log("Screen bpp: %d\n", SDL_BITSPERPIXEL(mode.format));
    SDL_Log("\n");
    SDL_Log("Vendor     : %s\n", ctx.glGetString(GL_VENDOR));
    SDL_Log("Renderer   : %s\n", ctx.glGetString(GL_RENDERER));
    SDL_Log("Version    : %s\n", ctx.glGetString(GL_VERSION));
    SDL_Log("Extensions : %s\n", ctx.glGetString(GL_EXTENSIONS));
    SDL_Log("\n");

    status = SDL_GL_GetAttribute(SDL_GL_RED_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_RED_SIZE: requested %d, got %d\n", 5, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_RED_SIZE: %s\n",
                SDL_GetError());
    }
    status = SDL_GL_GetAttribute(SDL_GL_GREEN_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_GREEN_SIZE: requested %d, got %d\n", 5, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_GREEN_SIZE: %s\n",
                SDL_GetError());
    }
    status = SDL_GL_GetAttribute(SDL_GL_BLUE_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_BLUE_SIZE: requested %d, got %d\n", 5, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_BLUE_SIZE: %s\n",
                SDL_GetError());
    }
    status = SDL_GL_GetAttribute(SDL_GL_DEPTH_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_DEPTH_SIZE: requested %d, got %d\n", depth, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_DEPTH_SIZE: %s\n",
                SDL_GetError());
    }
    if (fsaa) {
        status = SDL_GL_GetAttribute(SDL_GL_MULTISAMPLEBUFFERS, &value);
        if (!status) {
            SDL_Log("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n", value);
        } else {
            SDL_Log( "Failed to get SDL_GL_MULTISAMPLEBUFFERS: %s\n",
                    SDL_GetError());
        }
        status = SDL_GL_GetAttribute(SDL_GL_MULTISAMPLESAMPLES, &value);
        if (!status) {
            SDL_Log("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n", fsaa,
                   value);
        } else {
            SDL_Log( "Failed to get SDL_GL_MULTISAMPLESAMPLES: %s\n",
                    SDL_GetError());
        }
    }
    if (accel) {
        status = SDL_GL_GetAttribute(SDL_GL_ACCELERATED_VISUAL, &value);
        if (!status) {
            SDL_Log("SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n", value);
        } else {
            SDL_Log( "Failed to get SDL_GL_ACCELERATED_VISUAL: %s\n",
                    SDL_GetError());
        }
    }

    datas = SDL_calloc(state->num_windows, sizeof(shader_data));

    /* Set rendering settings for each context */
    for (i = 0; i < state->num_windows; ++i) {

        int w, h;
        status = SDL_GL_MakeCurrent(state->windows[i], context[i]);
        if (status) {
            SDL_Log("SDL_GL_MakeCurrent(): %s\n", SDL_GetError());

            /* Continue for next window */
            continue;
        }
        SDL_GL_GetDrawableSize(state->windows[i], &w, &h);
        ctx.glViewport(0, 0, w, h);

        data = &datas[i];
        data->angle_x = 0; data->angle_y = 0; data->angle_z = 0;

        /* Shader Initialization */
        process_shader(&data->shader_vert, _shader_vert_src, GL_VERTEX_SHADER);
        process_shader(&data->shader_frag, _shader_frag_src, GL_FRAGMENT_SHADER);

        /* Create shader_program (ready to attach shaders) */
        data->shader_program = GL_CHECK(ctx.glCreateProgram());

        /* Attach shaders and link shader_program */
        GL_CHECK(ctx.glAttachShader(data->shader_program, data->shader_vert));
        GL_CHECK(ctx.glAttachShader(data->shader_program, data->shader_frag));
        GL_CHECK(ctx.glLinkProgram(data->shader_program));

        /* Get attribute locations of non-fixed attributes like color and texture coordinates. */
        data->attr_position = GL_CHECK(ctx.glGetAttribLocation(data->shader_program, "av4position"));
        data->attr_color = GL_CHECK(ctx.glGetAttribLocation(data->shader_program, "av3color"));

        /* Get uniform locations */
        data->attr_mvp = GL_CHECK(ctx.glGetUniformLocation(data->shader_program, "mvp"));

        GL_CHECK(ctx.glUseProgram(data->shader_program));

        /* Enable attributes for position, color and texture coordinates etc. */
        GL_CHECK(ctx.glEnableVertexAttribArray(data->attr_position));
        GL_CHECK(ctx.glEnableVertexAttribArray(data->attr_color));

        /* Populate attributes for position, color and texture coordinates etc. */
        GL_CHECK(ctx.glVertexAttribPointer(data->attr_position, 3, GL_FLOAT, GL_FALSE, 0, _vertices));
        GL_CHECK(ctx.glVertexAttribPointer(data->attr_color, 3, GL_FLOAT, GL_FALSE, 0, _colors));

        GL_CHECK(ctx.glEnable(GL_CULL_FACE));
        GL_CHECK(ctx.glEnable(GL_DEPTH_TEST));
    }

    /* Main render loop */
    frames = 0;
    then = SDL_GetTicks();
    done = 0;

    while (!done) {
        loop();
    }

    /* Print out some timing information */
    now = SDL_GetTicks();

    if (now > then) {
        SDL_Log("%2.2f frames per second\n",
               ((double) frames * 1000) / (now - then));
    }

    quit(0);
    return 0;
}